

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchData::AssignOwnershipToThread
          (CSynchData *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  uint uVar1;
  DWORD DVar2;
  FILE *pFVar3;
  OwnershipSemantics OVar4;
  LONG LVar5;
  CObjectType *pCVar6;
  SIZE_T SVar7;
  SIZE_T SVar8;
  CPalSynchronizationManager *this_00;
  OwnedObjectsListNode *pooln_00;
  OwnedObjectsListNode *pooln;
  CPalSynchronizationManager *pSynchManager;
  PAL_ERROR palErr;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  CSynchData *this_local;
  
  pSynchManager._4_4_ = 0;
  pCVar6 = GetObjectType(this);
  OVar4 = CObjectType::GetOwnershipSemantics(pCVar6);
  if (OVar4 != OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x6cb);
    pFVar3 = _stderr;
    pCVar6 = GetObjectType(this);
    OVar4 = CObjectType::GetOwnershipSemantics(pCVar6);
    fprintf(pFVar3,
            "Expression: CObjectType::OwnershipTracked == GetObjectType()->GetOwnershipSemantics(), Description: AssignOwnershipToThread called on a non-ownable CSynchData [this=%p OwnershipSemantics=%u]\n"
            ,this,(ulong)OVar4);
  }
  if (this->m_lOwnershipCount < 1) {
    this_00 = CPalSynchronizationManager::GetInstance();
    pooln_00 = CPalSynchronizationManager::CacheGetOwnedObjsListNode(this_00,pthrCurrent);
    if (pooln_00 == (OwnedObjectsListNode *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pSynchManager._4_4_ = 8;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CPalThread::GetThreadId(pthrTarget);
      SetOwner(this,pthrTarget);
      SetOwnershipListNode(this,pooln_00);
      SetOwnershipCount(this,1);
      SetAbandoned(this,false);
      pooln_00->pPalObjSynchData = this;
      AddRef(this);
      CThreadSynchronizationInfo::AddObjectToOwnedList(&pthrTarget->synchronizationInfo,pooln_00);
    }
  }
  else {
    LVar5 = GetSignalCount(this);
    if (LVar5 != 0) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6d4);
      fprintf(_stderr,
              "Expression: 0 == GetSignalCount(), Description: Conflicting OwnershipCount and SignalCount values\n"
             );
    }
    if ((pthrTarget != this->m_pOwnerThread) || (gPID != this->m_dwOwnerPid)) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6db);
      pFVar3 = _stderr;
      DVar2 = gPID;
      SVar7 = CPalThread::GetThreadId(pthrTarget);
      uVar1 = this->m_dwOwnerPid;
      SVar8 = CPalThread::GetThreadId(this->m_pOwnerThread);
      fprintf(pFVar3,
              "Expression: pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid, Description: Attempting to assign ownership of CSynchData %p to thread {pid=%#x tid=%#x} while it is currently owned by thread {pid=%#x tid=%#x}\n"
              ,this,(ulong)DVar2,SVar7,(ulong)uVar1,SVar8);
    }
    this->m_lOwnershipCount = this->m_lOwnershipCount + 1;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CPalThread::GetThreadId(pthrTarget);
  }
  return pSynchManager._4_4_;
}

Assistant:

PAL_ERROR CSynchData::AssignOwnershipToThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        // Note: when this method is called by ReleaseFirstWaiter there is
        //       a small time window in which both SignalCount and 
        //       OwnershipCount can be greater than zero (which normally
        //       is illegal). Anyway that is fine since ReleaseFirstWaiter 
        //       will restore the value right after, and such situation
        //       takes place while holding synchroniztion locks, so no
        //       other thread/process can access the object.
                
        PAL_ERROR palErr = NO_ERROR;
        
        _ASSERT_MSG(CObjectType::OwnershipTracked ==
                    GetObjectType()->GetOwnershipSemantics(),
                    "AssignOwnershipToThread called on a non-ownable "
                    "CSynchData [this=%p OwnershipSemantics=%u]\n", this,
                    GetObjectType()->GetOwnershipSemantics());
        

        if (0 < m_lOwnershipCount)
        {
            //
            // Object already owned, incrementing ownership count
            //
            _ASSERT_MSG(0 == GetSignalCount(),
                        "Conflicting OwnershipCount and SignalCount values\n");
            
            _ASSERT_MSG(pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid,
                        "Attempting to assign ownership of CSynchData %p to "
                        "thread {pid=%#x tid=%#x} while it is currently owned "
                        "by thread {pid=%#x tid=%#x}\n", this,
                        gPID, pthrTarget->GetThreadId(),
                        m_dwOwnerPid, m_pOwnerThread->GetThreadId());

            m_lOwnershipCount++;

            TRACE("Incrementing ownership count for object with "
                  "SynchData %p owned by thread %#x [new count=%d]\n",
                  this, pthrTarget->GetThreadId(), m_lOwnershipCount);
        }
        else
        {
            //
            // Acquiring currently not owned object
            //            
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            OwnedObjectsListNode * pooln;

            pooln = pSynchManager->CacheGetOwnedObjsListNode(pthrCurrent);
            if (NULL == pooln)
            {
                ERROR("Out of memory while acquiring mutex ownership");                
                // In this case we bail out. It will result in no
                // thread being awakend, which may cause deadlock,
                // but it is anyway better than corrupting the 
                // ownership list
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOTT_exit;
            } 

            TRACE("Assigning ownable object with SynchData %p to "
                  "thread %#x\n",
                  this, pthrTarget->GetThreadId());

            // Set ownership data
            SetOwner(pthrTarget);
            SetOwnershipListNode(pooln);
            SetOwnershipCount(1);
            SetAbandoned(false);

            // Add object to list of owned objs for current thread
            pooln->pPalObjSynchData = this;
            AddRef();
            pthrTarget->synchronizationInfo.AddObjectToOwnedList(pooln);
        }
        
    AOTT_exit:
        return palErr;
    }